

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::CachingFileHandle::TryInsertFileRange
          (BufferHandle *__return_storage_ptr__,CachingFileHandle *this,BufferHandle *pin,
          data_ptr_t *buffer,idx_t nr_bytes,idx_t location,
          shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *new_file_range)

{
  map<unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
  *this_00;
  _Base_ptr *this_01;
  CachedFile *pCVar1;
  BufferHandle *pBVar2;
  bool bVar3;
  CachedFileRangeOverlap CVar4;
  iterator __position;
  CachedFileRange *pCVar5;
  type pCVar6;
  mapped_type *this_02;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> *guard_00;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> guard;
  StorageLock local_70;
  BufferHandle *local_60;
  CachingFileHandle *local_58;
  data_ptr_t *local_50;
  BufferHandle local_48;
  
  local_70.internals.internal.
  super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)location;
  local_60 = __return_storage_ptr__;
  local_50 = buffer;
  StorageLock::GetExclusiveLock(&local_70);
  pCVar1 = this->cached_file;
  this_00 = &pCVar1->ranges;
  local_58 = this;
  __position = ::std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
               ::lower_bound(&this_00->_M_t,
                             (key_type *)
                             &local_70.internals.internal.
                              super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
  while ((_Rb_tree_header *)__position._M_node !=
         &(pCVar1->ranges)._M_t._M_impl.super__Rb_tree_header) {
    this_01 = &__position._M_node[1]._M_parent;
    pCVar5 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                       ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_01);
    pCVar6 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*(new_file_range)
    ;
    CVar4 = ExternalFileCache::CachedFileRange::GetOverlap(pCVar5,pCVar6);
    if (CVar4 == FULL) {
      pCVar6 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                         ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_01);
      TryReadFromFileRange
                (&local_48,local_58,guard_00,pCVar6,local_50,location,
                 (idx_t)local_70.internals.internal.
                        super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi);
      BufferHandle::operator=(pin,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      bVar3 = BufferHandle::IsValid(pin);
      if (bVar3) goto LAB_01ac0bc2;
      __position = ::std::
                   _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>>
                   ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>>
                                       *)this_00,__position);
    }
    else {
      pCVar5 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->
                         (new_file_range);
      pCVar6 = shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator*
                         ((shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true> *)this_01);
      CVar4 = ExternalFileCache::CachedFileRange::GetOverlap(pCVar5,pCVar6);
      if (CVar4 == FULL) {
        __position = ::std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,true>>>>
                                         *)this_00,__position);
      }
      else {
        if (CVar4 == NONE) break;
        __position._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
      }
    }
  }
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator->(new_file_range);
  this_02 = ::std::
            map<unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>_>_>_>
            ::operator[](this_00,(key_type *)
                                 &local_70.internals.internal.
                                  super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
  shared_ptr<duckdb::ExternalFileCache::CachedFileRange,_true>::operator=(this_02,new_file_range);
LAB_01ac0bc2:
  pBVar2 = local_60;
  BufferHandle::BufferHandle(local_60,pin);
  ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
  ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
              &local_70);
  return pBVar2;
}

Assistant:

BufferHandle CachingFileHandle::TryInsertFileRange(BufferHandle &pin, data_ptr_t &buffer, idx_t nr_bytes,
                                                   idx_t location, shared_ptr<CachedFileRange> &new_file_range) {
	// Grab the lock again (write lock this time) to insert the newly created buffer into the ranges
	auto guard = cached_file.lock.GetExclusiveLock();
	auto &ranges = cached_file.Ranges(guard);

	// Start at lower_bound (first range with location not less than location of newly created range)
	for (auto it = ranges.lower_bound(location); it != ranges.end();) {
		if (it->second->GetOverlap(*new_file_range) == CachedFileRangeOverlap::FULL) {
			// Another thread has read a range that fully contains the requested range in the meantime
			pin = TryReadFromFileRange(guard, *it->second, buffer, nr_bytes, location);
			if (pin.IsValid()) {
				return std::move(pin);
			}
			it = ranges.erase(it);
			continue;
		}
		// Check if the new range overlaps with a cached one
		bool break_loop = false;
		switch (new_file_range->GetOverlap(*it->second)) {
		case CachedFileRangeOverlap::NONE:
			break_loop = true; // We iterated past potential overlaps
			break;
		case CachedFileRangeOverlap::PARTIAL:
			break; // The newly created range does not fully contain this range, so it is still useful
		case CachedFileRangeOverlap::FULL:
			// Full overlap, this range will be obsolete when we insert the current one
			// Since we have the write lock here, we can do some cleanup
			it = ranges.erase(it);
			continue;
		}
		if (break_loop) {
			break;
		}
		++it;
	}

	// Finally, insert newly created buffer into the map
	new_file_range->AddCheckSum();
	ranges[location] = std::move(new_file_range);
	cached_file.Verify(guard);

	return std::move(pin);
}